

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O1

bool __thiscall
Js::DebugDocument::FindBPStatementLocation
          (DebugDocument *this,UINT bpId,StatementLocation *statement)

{
  BreakpointProbeList *pBVar1;
  BreakpointProbe *this_00;
  long lVar2;
  long lVar3;
  
  pBVar1 = this->m_breakpointList;
  if (pBVar1 == (BreakpointProbeList *)0x0) {
    return false;
  }
  lVar2 = (long)(pBVar1->
                super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                count;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      this_00 = (pBVar1->
                super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                buffer[lVar3];
      if ((this_00 != (BreakpointProbe *)0x0) && (this_00->breakpointId == bpId)) {
        BreakpointProbe::GetStatementLocation(this_00,statement);
        return true;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return false;
}

Assistant:

bool DebugDocument::FindBPStatementLocation(UINT bpId, StatementLocation * statement)
    {
        bool foundStatement = false;
        if (m_breakpointList != nullptr)
        {
            m_breakpointList->MapUntil([&](int index, BreakpointProbe* bpProbe) -> bool
            {
                if (bpProbe != nullptr && bpProbe->GetId() == bpId)
                {
                    bpProbe->GetStatementLocation(statement);
                    foundStatement = true;
                    return true;
                }
                return false;
            });
        }
        return foundStatement;
    }